

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::PageTable::GetMappingType
          (PageTable *this,GMM_GFX_ADDRESS GfxVA,GMM_GFX_SIZE_T Size,GMM_GFX_ADDRESS *LastAddr)

{
  int iVar1;
  GMM_LIB_CONTEXT *pGVar2;
  WA_TABLE *pWVar3;
  GmmPageTablePool **ppGVar4;
  uint32_t **ppuVar5;
  sbyte sVar6;
  bool bVar7;
  int local_cc;
  int local_c8;
  int local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  int local_a8;
  int local_a4;
  long local_90;
  GMM_GFX_SIZE_T NumTiles_3;
  GMM_GFX_SIZE_T NumTiles_2;
  uint32_t NumTiles_1;
  uint32_t NumTiles;
  uint32_t BitNum;
  uint32_t UsageDW;
  uint32_t i;
  uint32_t LastBit;
  LastLevelTable *pL1Tbl;
  GMM_GFX_ADDRESS TileAddr;
  uint local_50;
  bool bTerminate;
  bool bFoundLastVA;
  uint uStack_4c;
  uint8_t MapType;
  uint32_t L2Size;
  uint32_t L1Size;
  GMM_GFX_SIZE_T L1EntrySize;
  GMM_GFX_SIZE_T L1eIdx;
  GMM_GFX_SIZE_T L2eIdx;
  GMM_GFX_SIZE_T L3eIdx;
  GMM_GFX_ADDRESS *LastAddr_local;
  GMM_GFX_SIZE_T Size_local;
  GMM_GFX_ADDRESS GfxVA_local;
  PageTable *this_local;
  
  TileAddr._7_1_ = '\0';
  TileAddr._6_1_ = 0;
  TileAddr._5_1_ = 0;
  L2eIdx = (GfxVA & 0xfff000000000) >> 0x24;
  L1eIdx = (GfxVA & 0xfff000000) >> 0x18;
  pL1Tbl = (LastLevelTable *)GfxVA;
  L3eIdx = (GMM_GFX_SIZE_T)LastAddr;
  LastAddr_local = (GMM_GFX_ADDRESS *)Size;
  Size_local = GfxVA;
  GfxVA_local = (GMM_GFX_ADDRESS)this;
  pGVar2 = GetGmmLibContext(this);
  pWVar3 = Context::GetWaTable(pGVar2);
  if ((*(uint *)&pWVar3->field_0x8 >> 0xe & 1) == 0) {
    pGVar2 = GetGmmLibContext(this);
    pWVar3 = Context::GetWaTable(pGVar2);
    local_a4 = 0x40;
    if ((*(uint *)&pWVar3->field_0x8 >> 0xf & 1) != 0) {
      local_a4 = 4;
    }
  }
  else {
    local_a4 = 1;
  }
  L1EntrySize = ((GfxVA & 0xffc000) >> 0xe) / (ulong)(long)local_a4;
  pGVar2 = GetGmmLibContext(this);
  pWVar3 = Context::GetWaTable(pGVar2);
  if ((*(uint *)&pWVar3->field_0x8 >> 0xe & 1) == 0) {
    pGVar2 = GetGmmLibContext(this);
    pWVar3 = Context::GetWaTable(pGVar2);
    local_a8 = 0x100000;
    if ((*(uint *)&pWVar3->field_0x8 >> 0xf & 1) != 0) {
      local_a8 = 0x10000;
    }
  }
  else {
    local_a8 = 0x4000;
  }
  _L2Size = (long)local_a8;
  EnterCriticalSection(&this->TTLock);
  while( true ) {
    bVar7 = false;
    if (((TileAddr._6_1_ & 1) == 0) && (bVar7 = false, (TileAddr._5_1_ & 1) == 0)) {
      bVar7 = pL1Tbl < (LastLevelTable *)(Size_local + (long)LastAddr_local);
    }
    if (!bVar7) break;
    ppGVar4 = Table::GetPool(&this->pTTL2[L2eIdx].super_Table);
    if (*ppGVar4 == (GmmPageTablePool *)0x0) {
      if (TileAddr._7_1_ == '\0') {
        if ((LastLevelTable *)Size_local == pL1Tbl) {
          TileAddr._7_1_ = '\0';
          pGVar2 = GetGmmLibContext(this);
          pWVar3 = Context::GetWaTable(pGVar2);
          if ((*(uint *)&pWVar3->field_0x8 >> 0xe & 1) == 0) {
            pGVar2 = GetGmmLibContext(this);
            pWVar3 = Context::GetWaTable(pGVar2);
            local_c8 = 0x40;
            if ((*(uint *)&pWVar3->field_0x8 >> 0xf & 1) != 0) {
              local_c8 = 4;
            }
          }
          else {
            local_c8 = 1;
          }
          uStack_4c = (int)(0x400 / (ulong)(long)local_c8) - (int)L1EntrySize;
          local_50 = 0x1000 - (int)L1eIdx;
          local_90 = (ulong)uStack_4c * (ulong)local_50;
        }
        else {
          pGVar2 = GetGmmLibContext(this);
          pWVar3 = Context::GetWaTable(pGVar2);
          if ((*(uint *)&pWVar3->field_0x8 >> 0xe & 1) == 0) {
            pGVar2 = GetGmmLibContext(this);
            pWVar3 = Context::GetWaTable(pGVar2);
            local_cc = 0x40;
            if ((*(uint *)&pWVar3->field_0x8 >> 0xf & 1) != 0) {
              local_cc = 4;
            }
          }
          else {
            local_cc = 1;
          }
          uStack_4c = (uint)(0x400U / (ulong)(long)local_cc);
          local_50 = 0x1000;
          local_90 = (0x400U / (ulong)(long)local_cc) * 0x1000;
        }
        pL1Tbl = (LastLevelTable *)((long)&(pL1Tbl->super_Table).PoolElem + local_90 * _L2Size);
        L1eIdx = 0;
        L1EntrySize = 0;
        L2eIdx = L2eIdx + 1;
        if (L2eIdx == 0x1000) {
          TileAddr._5_1_ = 1;
        }
      }
      else {
        *(LastLevelTable **)L3eIdx = pL1Tbl;
        TileAddr._6_1_ = 1;
      }
    }
    else {
      _i = (LastLevelTable *)0x0;
      _i = MidLevelTable::GetL1Table(this->pTTL2 + L2eIdx,L1eIdx,(LastLevelTable **)0x0);
      if ((_i == (LastLevelTable *)0x0) ||
         (ppGVar4 = Table::GetPool(&_i->super_Table), *ppGVar4 == (GmmPageTablePool *)0x0)) {
        if (TileAddr._7_1_ == '\0') {
          pGVar2 = GetGmmLibContext(this);
          pWVar3 = Context::GetWaTable(pGVar2);
          if ((*(uint *)&pWVar3->field_0x8 >> 0xe & 1) == 0) {
            pGVar2 = GetGmmLibContext(this);
            pWVar3 = Context::GetWaTable(pGVar2);
            local_c4 = 0x40;
            if ((*(uint *)&pWVar3->field_0x8 >> 0xf & 1) != 0) {
              local_c4 = 4;
            }
          }
          else {
            local_c4 = 1;
          }
          NumTiles_3 = (GMM_GFX_SIZE_T)(int)(0x400 / (ulong)(long)local_c4);
          if ((LastLevelTable *)Size_local == pL1Tbl) {
            TileAddr._7_1_ = '\0';
            NumTiles_3 = NumTiles_3 - L1EntrySize;
          }
          pL1Tbl = (LastLevelTable *)((long)&(pL1Tbl->super_Table).PoolElem + NumTiles_3 * _L2Size);
          L1EntrySize = 0;
          L1eIdx = L1eIdx + 1;
          if (L1eIdx == 0x1000) {
            L1eIdx = 0;
            L2eIdx = L2eIdx + 1;
            if (L2eIdx == 0x1000) {
              TileAddr._5_1_ = 1;
            }
          }
        }
        else {
          *(LastLevelTable **)L3eIdx = pL1Tbl;
          TileAddr._6_1_ = 1;
        }
      }
      else {
        UsageDW = 0;
        BitNum = (uint)(L1EntrySize >> 5) & 0x7ffffff;
        while( true ) {
          bVar7 = false;
          if ((TileAddr._6_1_ & 1) == 0) {
            pGVar2 = GetGmmLibContext(this);
            pWVar3 = Context::GetWaTable(pGVar2);
            iVar1 = 4;
            if ((*(uint *)&pWVar3->field_0x8 >> 0xe & 1) != 0) {
              iVar1 = 1;
            }
            bVar7 = BitNum < ((int)(0x400 / (ulong)(long)iVar1) + 0x1fU) / 0x20;
          }
          if (!bVar7) break;
          ppuVar5 = Table::GetUsedEntries(&_i->super_Table);
          local_b8 = (*ppuVar5)[BitNum];
          NumTiles_1 = 0x1f;
          if ((LastLevelTable *)Size_local == pL1Tbl) {
            NumTiles_1 = (uint)L1EntrySize & 0x1f;
            sVar6 = (sbyte)NumTiles_1;
            TileAddr._7_1_ = ((ulong)local_b8 & 1L << sVar6) != 0;
            local_b4 = local_b8;
            if ((bool)TileAddr._7_1_) {
              local_b4 = local_b8 ^ 0xffffffff;
            }
            NumTiles = (local_b4 >> sVar6 + 1) << sVar6 + 1;
          }
          else {
            if (TileAddr._7_1_ != '\0') {
              local_b8 = local_b8 ^ 0xffffffff;
            }
            NumTiles = local_b8;
          }
          iVar1 = _BitScanForward(&UsageDW,NumTiles);
          if (iVar1 == 0) {
            if ((LastLevelTable *)Size_local == pL1Tbl) {
              local_c0 = 0x20 - NumTiles_1;
            }
            else {
              local_c0 = 0x20;
            }
            pL1Tbl = (LastLevelTable *)
                     ((long)&(pL1Tbl->super_Table).PoolElem + (ulong)local_c0 * _L2Size);
            BitNum = BitNum + 1;
          }
          else {
            TileAddr._6_1_ = 1;
            if ((LastLevelTable *)Size_local == pL1Tbl) {
              local_bc = UsageDW - NumTiles_1;
            }
            else {
              local_bc = UsageDW;
            }
            *(GMM_PAGETABLEPool ***)L3eIdx =
                 (GMM_PAGETABLEPool **)
                 ((long)&(pL1Tbl->super_Table).PoolElem + (ulong)local_bc * _L2Size);
            BitNum = BitNum + 1;
          }
        }
        if ((TileAddr._6_1_ & 1) == 0) {
          L1EntrySize = 0;
          L1eIdx = L1eIdx + 1;
          if (L1eIdx == 0x1000) {
            L1eIdx = 0;
            L2eIdx = L2eIdx + 1;
            if (L2eIdx == 0x1000) {
              TileAddr._5_1_ = 1;
            }
          }
        }
      }
    }
  }
  if ((TileAddr._6_1_ & 1) == 0) {
    *(LastLevelTable **)L3eIdx = pL1Tbl;
  }
  LeaveCriticalSection(&this->TTLock);
  return TileAddr._7_1_;
}

Assistant:

uint8_t GmmLib::PageTable::GetMappingType(GMM_GFX_ADDRESS GfxVA, GMM_GFX_SIZE_T Size, GMM_GFX_ADDRESS &LastAddr)
{
    GMM_GFX_SIZE_T  L3eIdx, L2eIdx, L1eIdx, L1EntrySize;
    uint32_t        L1Size, L2Size;
    uint8_t         MapType      = 0; //true for non-null, false for null mapped
    bool            bFoundLastVA = false, bTerminate = false;
    GMM_GFX_ADDRESS TileAddr = GfxVA;

    L3eIdx      = GMM_L3_ENTRY_IDX(TTType, GfxVA);
    L2eIdx      = GMM_L2_ENTRY_IDX(TTType, GfxVA);
    L1eIdx      = GMM_L1_ENTRY_IDX(TTType, GfxVA, GetGmmLibContext());
    L1EntrySize = WA16K(GetGmmLibContext()) ? GMM_KBYTE(16) : WA64K(GetGmmLibContext()) ? GMM_KBYTE(64) : GMM_MBYTE(1);

    EnterCriticalSection(&TTLock);
    __GMM_ASSERT(TTL3.L3Handle);

#define GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = 0;                              \
        L2eIdx++;                                \
        if(L2eIdx == (GMM_L2_SIZE(TTType)))      \
        {                                        \
            L2eIdx = 0;                          \
            L3eIdx++;                            \
            if(L3eIdx == (GMM_L3_SIZE(TTType)))  \
            {                                    \
                bTerminate = true;               \
            }                                    \
        }                                        \
    }

#define GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = L2eIdx = 0;                     \
        L3eIdx++;                                \
        if(L3eIdx == (GMM_L3_SIZE(TTType)))      \
        {                                        \
            bTerminate = true;                   \
        }                                        \
    }

    while(!(bFoundLastVA || bTerminate) && (TileAddr < GfxVA + Size))
    {
        if(pTTL2[L3eIdx].GetPool())
        {
            GmmLib::LastLevelTable *pL1Tbl = NULL;
            pL1Tbl                         = pTTL2[L3eIdx].GetL1Table(L2eIdx);
            if(pL1Tbl && pL1Tbl->GetPool())
            {
                uint32_t LastBit = 0;
                uint32_t i       = static_cast<uint32_t>(L1eIdx) / 32;

                while(!bFoundLastVA && i < (uint32_t)(GMM_L1_SIZE_DWORD(TTType, GetGmmLibContext())))
                {
                    uint32_t UsageDW = pL1Tbl->GetUsedEntries()[i++];
                    uint32_t BitNum  = 31;
                    if(GfxVA == TileAddr)
                    {
                        BitNum  = L1eIdx % 32;
                        MapType = ((UsageDW & __BIT(BitNum)) ? 0x1 : 0x0); //true for non-null, false for null mapped
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                        UsageDW = ((uint64_t)UsageDW >> (BitNum + 1)) << (BitNum + 1); // clear lsb <= BitNum
                    }
                    else
                    {
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                    }

                    if(_BitScanForward((uint32_t *)&LastBit, UsageDW)) // Gets lsb > BitNum, having reverse mapType
                    {
                        bFoundLastVA      = true;
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (LastBit - BitNum) : LastBit;
                        LastAddr          = TileAddr + NumTiles * L1EntrySize;
                    }
                    else
                    {
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (32 - BitNum) : 32;
                        TileAddr += NumTiles * L1EntrySize;
                    }
                }
                if(!bFoundLastVA)
                {
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx);
                }
            }
            else //L2Entry is NULL
            {
                if(MapType) //First hit null-map
                {
                    LastAddr     = TileAddr;
                    bFoundLastVA = true;
                }
                else
                {
                    GMM_GFX_SIZE_T NumTiles = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());			
                    if(GfxVA == TileAddr)
                    {
                        MapType = false;
                        NumTiles -= L1eIdx;
                    }
                    TileAddr += NumTiles * L1EntrySize;
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx)
                }
            }
        }
        else //L3entry is NULL
        {
            if(MapType) //First hit null-map
            {
                LastAddr     = TileAddr;
                bFoundLastVA = true;
            }
            else
            {
                GMM_GFX_SIZE_T NumTiles = 0;
                if(GfxVA == TileAddr)
                {
                    MapType  = false;
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext()) - L1eIdx;
                    L2Size   = GMM_L2_SIZE(TTType) - L2eIdx;
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                else
                {
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());
                    L2Size   = GMM_L2_SIZE(TTType);
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                TileAddr += NumTiles * L1EntrySize;
                GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx)
            }
        }
    }

    if(!bFoundLastVA)
    {
        LastAddr = TileAddr;
    }

    LeaveCriticalSection(&TTLock);
    return MapType;
}